

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O1

void ansv<unsigned_long,2,2,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  long lVar1;
  pair<unsigned_long,_unsigned_long> *ppVar2;
  int iVar3;
  void *pvVar4;
  pointer puVar5;
  pointer puVar6;
  comm *comm_00;
  _Map_pointer pppVar7;
  _Map_pointer pppVar8;
  comm *comm_01;
  unsigned_long uVar9;
  ulong uVar10;
  long *plVar11;
  _Elt_pointer ppVar12;
  _Elt_pointer ppVar13;
  _Elt_pointer ppVar14;
  _Elt_pointer ppVar15;
  pair<unsigned_long,_unsigned_long> *ppVar16;
  unsigned_long uVar17;
  _Elt_pointer ppVar18;
  _Elt_pointer ppVar19;
  ulong *puVar20;
  unsigned_long uVar21;
  unsigned_long uVar22;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar23;
  size_type sVar24;
  unsigned_long *puVar25;
  _Elt_pointer ppVar26;
  ulong uVar27;
  _Elt_pointer ppVar28;
  _Elt_pointer ppVar29;
  _Elt_pointer ppVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  ulong uVar37;
  _Elt_pointer ppVar38;
  int iVar39;
  long lVar40;
  ulong uVar41;
  _Elt_pointer ppVar42;
  _Elt_pointer ppVar43;
  bool bVar44;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  pointer local_1f0;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_1e8;
  _Elt_pointer local_198;
  _Elt_pointer local_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_188;
  comm *local_180;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_178;
  _Elt_pointer local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  _Elt_pointer local_150;
  size_type local_140;
  ulong local_138;
  pair<unsigned_long,_unsigned_long> local_130;
  ulong local_120;
  unsigned_long local_118;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_110;
  unsigned_long local_f8;
  size_type local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  _Elt_pointer local_88;
  unsigned_long local_80;
  unsigned_long local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_70;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_50;
  
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_178 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_f8 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_1e8,0);
  local_f0 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  local_180 = comm;
  uVar9 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_f0,comm);
  lVar40 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_188 = in;
  if (lVar40 != 0) {
    lVar40 = lVar40 >> 3;
LAB_00137d44:
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar13 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if ((local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar40 + -1] < ppVar13[-1].first) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_00137d44;
        }
      }
      while (lVar31 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4,
            1 < ((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) + lVar31 +
                ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)((_Elt_pointer)
                             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Elt_pointer)0x0)) * 0x20) {
        ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar13 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        uVar22 = (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar40 + -1];
        if (uVar22 != ppVar13[-1].first) break;
        uVar10 = lVar31 - 1;
        if (uVar10 < 0x20) {
          ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          ppVar14 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        }
        else {
          uVar41 = uVar10 >> 5 | 0xf800000000000000;
          if (1 < lVar31) {
            uVar41 = uVar10 >> 5;
          }
          ppVar14 = (_Elt_pointer)
                    ((unsigned_long *)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                    uVar41);
          ppVar15 = (_Elt_pointer)ppVar14->first;
          ppVar13 = ppVar15 + uVar10 + uVar41 * -0x20;
        }
        if (ppVar13 == ppVar15) {
          ppVar13 = (_Elt_pointer)(ppVar14[-1].second + 0x200);
        }
        if (uVar22 != ppVar13[-1].first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(lVar40 + (uVar9 - 1));
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar40 + -1];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar40 = lVar40 + -1;
    } while (lVar40 != 0);
  }
  local_50.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_50.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_50.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_50.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_70.current._M_cur = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_70.current._M_first = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_70.current._M_last = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  local_70.current._M_node = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_168,&local_50,&local_70,(allocator_type *)&local_a0);
  pvVar4 = *(void **)local_178;
  *(pointer *)local_178 =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_178 + 8) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_178 + 0x10) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4);
  }
  if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar7 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_198 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar10 = ((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)((_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                  (_Elt_pointer)0x0)) * 0x20;
  local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar13 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  pvVar23 = local_188;
  if (uVar10 == 0) {
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 0]"
                 );
  }
  for (; local_188 = pvVar23, ppVar13 < pppVar8; ppVar13 = (_Elt_pointer)&ppVar13->second) {
    operator_delete((void *)ppVar13->second);
    pvVar23 = local_188;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar7;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_190;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_198;
  if ((pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar41 = 0;
LAB_00138099:
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar13 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if ((pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar41] < ppVar13[-1].first) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          goto LAB_00138099;
        }
      }
      while (lVar40 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first >> 4,
            1 < ((long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) + lVar40 +
                ((((ulong)((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
                          (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)((_Elt_pointer)
                             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Elt_pointer)0x0)) * 0x20) {
        ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar13 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        uVar22 = (pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar41];
        if (uVar22 != ppVar13[-1].first) break;
        uVar37 = lVar40 - 1;
        if (uVar37 < 0x20) {
          ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          ppVar14 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
        }
        else {
          uVar35 = uVar37 >> 5 | 0xf800000000000000;
          if (1 < lVar40) {
            uVar35 = uVar37 >> 5;
          }
          ppVar14 = (_Elt_pointer)
                    ((unsigned_long *)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                    uVar35);
          ppVar15 = (_Elt_pointer)ppVar14->first;
          ppVar13 = ppVar15 + uVar37 + uVar35 * -0x20;
        }
        if (ppVar13 == ppVar15) {
          ppVar13 = (_Elt_pointer)(ppVar14[-1].second + 0x200);
        }
        if (uVar22 != ppVar13[-1].first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
               (_Elt_pointer)
               ((_Elt_pointer)
               ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
               (_Map_pointer)
               &((_Elt_pointer)
                ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second;
        }
        else {
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar41 + uVar9);
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar41];
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 < (ulong)((long)(pvVar23->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar23->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar18 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar41 = (long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar44 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node ==
           (_Elt_pointer)0x0;
  local_198 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_150 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_88 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_178,*(undefined8 *)(local_178 + 8));
  pppVar7 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_118 = (local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar40 = ((long)ppVar13 - (long)local_198 >> 4) + ((long)ppVar15 - (long)ppVar18 >> 4) +
           (((uVar41 >> 3) - 1) + (ulong)bVar44) * 0x20;
  ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  local_170 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar18 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar13 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  comm_00 = local_180;
  if (lVar40 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 0]"
                 );
  }
  for (; local_198 = ppVar18, local_190 = ppVar15, local_180 = comm_00, ppVar13 < pppVar7;
      ppVar13 = (_Elt_pointer)&ppVar13->second) {
    operator_delete((void *)ppVar13->second);
    ppVar15 = local_190;
    ppVar18 = local_198;
    comm_00 = local_180;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_190;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_170;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)local_198;
  if (lVar40 + uVar10 != (long)(*(ulong *)(local_178 + 8) - *(ulong *)local_178) >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 0]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_168,&local_118,1,comm_00);
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_a0,(long)comm_00->m_size,(value_type_conflict *)&local_b8,
             (allocator_type *)&local_e8);
  local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b8,(long)comm_00->m_size,(value_type_conflict *)&local_e8,
             (allocator_type *)&local_d0);
  comm_01 = local_180;
  iVar3 = comm_00->m_rank;
  lVar40 = (long)iVar3;
  if (0 < lVar40) {
    uVar41 = *(ulong *)((long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar40 * 8 + -8);
    local_198 = *(_Elt_pointer *)local_178;
    uVar22 = 0;
    lVar31 = lVar40;
    do {
      uVar17 = uVar22;
      if ((uVar22 != 0 && lVar31 < lVar40) &&
         (uVar17 = uVar22 - 1, uVar41 < local_198[uVar22 - 1].first)) {
        uVar17 = uVar22;
      }
      lVar1 = lVar31 + -1;
      uVar37 = uVar22 + 1;
      if (uVar22 + 1 < uVar10) {
        uVar37 = uVar10;
      }
      puVar20 = (ulong *)(uVar22 * 0x10 + *(ulong *)local_178);
      uVar21 = uVar22 - 1;
      do {
        uVar22 = uVar37 - 1;
        if (uVar21 + (1 - uVar37) == -1) break;
        uVar35 = *puVar20;
        uVar22 = uVar21 + 1;
        puVar20 = puVar20 + 2;
        uVar21 = uVar22;
      } while (*(ulong *)((long)local_168.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar1 * 8) <= uVar35);
      uVar37 = *(ulong *)((long)local_168.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar1 * 8);
      iVar36 = 0x12;
      if (uVar37 <= uVar41) {
        *(unsigned_long *)
         ((long)local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar1 * 8) = (uVar22 - uVar17) + 1;
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar1] = uVar17;
        iVar36 = (uint)(*(ulong *)((long)local_168.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar1 * 8) <
                       local_118) << 4;
        uVar41 = uVar37;
      }
    } while (((iVar36 == 0x12) || (iVar36 == 0)) && (bVar44 = 1 < lVar31, lVar31 = lVar1, bVar44));
  }
  iVar36 = local_180->m_size;
  if ((iVar3 < iVar36 + -1) && (iVar3 + 1 < iVar36)) {
    uVar41 = *(ulong *)local_178;
    uVar27 = (long)(*(ulong *)(local_178 + 8) - uVar41) >> 4;
    uVar37 = ((unsigned_long *)
             ((long)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar40];
    local_198 = (_Elt_pointer)
                local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar40 = lVar40 + 1;
    local_190 = (_Elt_pointer)(uVar41 + 0x10);
    uVar35 = uVar27 - 1;
    iVar39 = iVar3;
    do {
      uVar34 = uVar35;
      if (iVar3 < iVar39) {
        uVar32 = uVar35 + 1;
        if (uVar35 + 1 < uVar27) {
          uVar32 = uVar27;
        }
        ppVar13 = local_190 + uVar35;
        uVar33 = uVar35 - 1;
        do {
          uVar34 = uVar32 - 1;
          if (uVar27 <= uVar33 + 2) break;
          uVar34 = uVar33 + 1;
          puVar25 = &ppVar13->first;
          ppVar13 = ppVar13 + 1;
          uVar33 = uVar34;
        } while (*puVar25 <= uVar37);
      }
      uVar32 = uVar35;
      if (uVar10 < uVar35) {
        puVar20 = (ulong *)(uVar35 * 0x10 + uVar41);
        do {
          uVar32 = uVar35;
          if (*puVar20 <
              local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar40]) break;
          uVar35 = uVar35 - 1;
          puVar20 = puVar20 + -2;
          uVar32 = uVar10;
        } while (uVar10 < uVar35);
      }
      uVar35 = local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar40];
      iVar39 = 0x17;
      if (uVar35 <= uVar37) {
        local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar40] = (uVar34 - uVar32) + 1;
        local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar40] = uVar32;
        iVar39 = 0;
        uVar37 = uVar35;
        if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar40] < local_118) {
          iVar39 = 0x15;
        }
      }
      if ((iVar39 != 0x17) && (iVar39 != 0)) break;
      iVar39 = (int)lVar40;
      lVar40 = lVar40 + 1;
      uVar35 = uVar32;
    } while (iVar36 != (int)lVar40);
  }
  mxx::all2all<unsigned_long>(&local_e8,&local_a0,local_180);
  mxx::impl::get_displacements<unsigned_long>(&local_d0,&local_e8);
  uVar22 = local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  local_78 = local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
  sVar24 = local_78 + uVar22;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_110,sVar24,(allocator_type *)&local_130);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_178,&local_a0,&local_b8,
             local_110.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_e8,&local_d0,comm_01);
  local_180 = (comm *)local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[comm_01->m_rank];
  local_140 = sVar24;
  local_80 = uVar22;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(right_nsv,local_f0);
  pppVar8 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar7 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_198 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  pvVar23 = local_188;
  for (ppVar13 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
      local_188 = pvVar23, ppVar13 < pppVar8; ppVar13 = (_Elt_pointer)&ppVar13->second) {
    operator_delete((void *)ppVar13->second);
    pvVar23 = local_188;
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar7;
  lVar40 = (long)(pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = local_198;
  if (lVar40 != 0) {
    lVar40 = lVar40 >> 3;
    local_190 = (_Elt_pointer)(uVar9 - 1);
    do {
      uVar22 = (long)local_190 + lVar40;
      lVar40 = lVar40 + -1;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_198 = (_Elt_pointer)
                    (pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        do {
          ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar13 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (ppVar13[-1].first <= *(ulong *)((long)local_198 + lVar40 * 8)) break;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar17 = ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[*(long *)(uVar17 + 0x1f8) - uVar9] = uVar22;
            ppVar13 = (_Elt_pointer)(uVar17 + 0x200);
          }
          else {
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar9] = uVar22;
            ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar17 = ppVar13[-1].first;
          uVar21 = ppVar13[-1].second;
          while( true ) {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar13 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            if (uVar17 != ppVar13[-1].first) break;
            ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar13 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar13[-1].second - uVar9] = uVar21;
          }
          pvVar23 = local_188;
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      local_130.first =
           (pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar40];
      local_130.second = uVar22;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_130);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_130.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar22;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (lVar40 != 0);
  }
  if (local_180 != (comm *)0x0) {
    local_120 = (long)local_180 - 1;
    local_138 = (long)local_180 * 0x10 - 0x10;
    uVar10 = 0;
    do {
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      local_190 = (_Elt_pointer)(~uVar10 + (long)local_180);
      local_170 = (_Elt_pointer)((long)local_190 * 0x10);
      local_198 = (_Elt_pointer)
                  local_110.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)local_190].second;
      ppVar16 = local_110.
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)local_190;
      do {
        ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar13 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if (ppVar13[-1].first <= ppVar16->first) break;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          uVar22 = ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[*(long *)(uVar22 + 0x1f8) - uVar9] =
               (unsigned_long)local_198;
          ppVar13 = (_Elt_pointer)(uVar22 + 0x200);
        }
        else {
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar9] =
               (unsigned_long)local_198;
          ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        uVar22 = ppVar13[-1].first;
        uVar17 = ppVar13[-1].second;
        while( true ) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
          ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar13 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (uVar22 != ppVar13[-1].first) break;
          ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar13 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar13[-1].second - uVar9] = uVar17;
        }
      } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar13 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if (*(unsigned_long *)
             ((long)&local_170->first +
             (long)&(local_110.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar13[-1].first) {
          ppVar13 = local_190;
          if (local_190 != (_Elt_pointer)0x0) {
            plVar11 = (long *)((long)&local_110.
                                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-uVar10].first +
                              local_138);
            do {
              if (*plVar11 != plVar11[-2]) goto LAB_00138bd8;
              uVar10 = uVar10 + 1;
              plVar11 = plVar11 + -2;
              ppVar13 = (_Elt_pointer)((long)ppVar13 + -1);
            } while (ppVar13 != (_Elt_pointer)0x0);
            ppVar13 = (_Elt_pointer)0x0;
            uVar10 = local_120;
          }
LAB_00138bd8:
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
            do {
              ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar14 = (_Elt_pointer)
                          (((_Elt_pointer)
                           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10
                           ))->second + 0x200);
              }
              if (ppVar14[-1].first !=
                  local_110.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)ppVar13].first) break;
              if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start
                [*(long *)(((_Elt_pointer)
                           ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10
                           ))->second + 0x1f8) - uVar9] =
                     local_110.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)ppVar13].second;
                operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                     (_Elt_pointer)
                     ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                     (_Map_pointer)
                     &((_Elt_pointer)
                      ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                      second;
              }
              else {
                (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start
                [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar9] =
                     local_110.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)ppVar13].second;
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
              }
            } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                     local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < local_180);
  }
  pvVar23 = local_188;
  pppVar7 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_190 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    puVar5 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ppVar18 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar12 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar29 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      puVar6 = (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      ppVar19 = ppVar18;
      ppVar26 = ppVar12;
      ppVar43 = ppVar29;
      while( true ) {
        lVar40 = (long)ppVar26 - (long)ppVar43 >> 4;
        uVar10 = lVar40 - 1;
        if (uVar10 < 0x20) {
          ppVar42 = ppVar26 + -1;
        }
        else {
          uVar41 = uVar10 >> 5 | 0xf800000000000000;
          if (1 < lVar40) {
            uVar41 = uVar10 >> 5;
          }
          ppVar42 = (_Elt_pointer)((uVar10 + uVar41 * -0x20) * 0x10 + (&ppVar19->first)[uVar41]);
        }
        if (ppVar42 == local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        ppVar42 = ppVar12;
        if (ppVar12 == ppVar29) {
          ppVar42 = (_Elt_pointer)(ppVar18[-1].second + 0x200);
        }
        if (uVar10 < 0x20) {
          ppVar38 = ppVar26 + -1;
          ppVar28 = ppVar43;
          ppVar30 = ppVar19;
        }
        else {
          uVar41 = uVar10 >> 5 | 0xf800000000000000;
          if (1 < lVar40) {
            uVar41 = uVar10 >> 5;
          }
          ppVar30 = (_Elt_pointer)(&ppVar19->first + uVar41);
          ppVar28 = (_Elt_pointer)ppVar30->first;
          ppVar38 = ppVar28 + uVar10 + uVar41 * -0x20;
        }
        if (ppVar38 == ppVar28) {
          ppVar38 = (_Elt_pointer)(ppVar30[-1].second + 0x200);
        }
        if (ppVar42[-1].first != ppVar38[-1].first) break;
        if (ppVar26 == ppVar43) {
          ppVar43 = (_Elt_pointer)ppVar19[-1].second;
          ppVar19 = (_Elt_pointer)&ppVar19[-1].second;
          ppVar26 = ppVar43 + 0x20;
        }
        ppVar42 = ppVar12;
        if (ppVar12 == ppVar29) {
          ppVar42 = (_Elt_pointer)(ppVar18[-1].second + 0x200);
        }
        ppVar26 = ppVar26 + -1;
        ppVar38 = ppVar26;
        if (ppVar26 == ppVar43) {
          ppVar38 = (_Elt_pointer)(ppVar19[-1].second + 0x200);
        }
        puVar6[ppVar38[-1].second - uVar9] = ppVar42[-1].second;
      }
      if (ppVar12 == ppVar29) {
        ppVar12 = (_Elt_pointer)(ppVar18[-1].second + 0x200);
      }
      puVar5[ppVar12[-1].second - uVar9] = local_f8;
      if (ppVar26 == ppVar43) {
        ppVar43 = (_Elt_pointer)ppVar19[-1].second;
        ppVar19 = (_Elt_pointer)&ppVar19[-1].second;
        ppVar26 = ppVar43 + 0x20;
      }
      ppVar12 = ppVar26 + -1;
      ppVar18 = ppVar19;
      ppVar29 = ppVar43;
    } while (ppVar12 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  ppVar18 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_start._M_node;
  local_198 = (_Elt_pointer)right_nsv;
  if (local_1e8._M_impl.super__Deque_impl_data._M_start._M_node <
      local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node) {
    do {
      puVar25 = &ppVar18->second;
      operator_delete((void *)ppVar18->second);
      ppVar18 = (_Elt_pointer)puVar25;
    } while (puVar25 < local_190);
  }
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar13;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar14;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar15;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar7;
  local_1f0 = (pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
  if ((pvVar23->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != local_1f0) {
    uVar10 = 0;
    do {
      uVar22 = uVar10 + uVar9;
LAB_00138efe:
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar13 = (_Elt_pointer)
                    (((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second + 0x200);
        }
        if (ppVar13[-1].first <= local_1f0[uVar10]) goto LAB_00139016;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          uVar17 = ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
          (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[*(long *)(uVar17 + 0x1f8) - uVar9] = uVar22;
          ppVar13 = (_Elt_pointer)(uVar17 + 0x200);
        }
        else {
          (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar9] = uVar22;
          ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        }
        uVar17 = ppVar13[-1].first;
        uVar21 = ppVar13[-1].second;
        while( true ) {
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                 (_Elt_pointer)
                 ((_Elt_pointer)
                 ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->second
            ;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                 (_Map_pointer)
                 &((_Elt_pointer)
                  ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                  second;
          }
          else {
            local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
          ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar13 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (uVar17 != ppVar13[-1].first) break;
          ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar13 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar13[-1].second - uVar9] = uVar21;
        }
        goto LAB_00138efe;
      }
LAB_00139016:
      local_130.first =
           (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar10];
      local_130.second = uVar22;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_1e8,&local_130);
      }
      else {
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_130.first;
        (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar22;
        local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar10 = uVar10 + 1;
      local_1f0 = (local_188->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(local_188->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)local_1f0 >>
                             3));
  }
  if ((comm *)local_140 != local_180) {
    sVar24 = local_140 - (long)local_180;
    local_120 = (local_80 + local_78) - 1;
    uVar10 = 0;
    local_140 = sVar24;
    do {
      ppVar13 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_190 = local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_138 = (long)local_180 + uVar10;
        local_170 = (_Elt_pointer)(local_138 * 0x10);
        local_188 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    local_110.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_138].second;
        ppVar16 = local_110.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_138;
        do {
          ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar14 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (ppVar14[-1].first <= ppVar16->first) break;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            uVar22 = ((_Elt_pointer)
                     ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                     second;
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[*(long *)(uVar22 + 0x1f8) - uVar9] =
                 (unsigned_long)local_188;
            ppVar14 = (_Elt_pointer)(uVar22 + 0x200);
          }
          else {
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar9] =
                 (unsigned_long)local_188;
            ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar22 = ppVar14[-1].first;
          uVar17 = ppVar14[-1].second;
          while( true ) {
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   (_Elt_pointer)
                   ((_Elt_pointer)
                   ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                   second;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   (_Map_pointer)
                   &((_Elt_pointer)
                    ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                    second;
            }
            else {
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
            ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar14 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            if (uVar22 != ppVar14[-1].first) break;
            ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVar14 = (_Elt_pointer)
                        (((_Elt_pointer)
                         ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                         ->second + 0x200);
            }
            (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar14[-1].second - uVar9] = uVar17;
          }
        } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
        sVar24 = local_140;
        ppVar14 = local_190;
        if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar15 = (_Elt_pointer)
                      (((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second + 0x200);
          }
          if (*(unsigned_long *)
               ((long)&local_170->first +
               (long)&(local_110.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar15[-1].first) {
            uVar41 = local_138;
            if ((uVar10 + 1 < local_140) &&
               (*(long *)((long)&local_170->first +
                         (long)&(local_110.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first) ==
                *(long *)((long)&local_170->first +
                         (long)&local_110.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].first))) {
              ppVar16 = local_110.
                        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)local_180 + uVar10 + 2;
              do {
                uVar37 = uVar10;
                uVar41 = local_120;
                if (local_140 <= uVar37 + 2) goto LAB_00139577;
                ppVar2 = ppVar16 + -1;
                puVar25 = &ppVar16->first;
                ppVar16 = ppVar16 + 1;
                uVar10 = uVar37 + 1;
              } while (ppVar2->first == *puVar25);
              uVar41 = uVar37 + 1 + (long)local_180;
LAB_00139577:
              uVar10 = uVar37 + 1;
            }
            if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
              do {
                ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppVar15 = (_Elt_pointer)
                            (((_Elt_pointer)
                             ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                             -0x10))->second + 0x200);
                }
                ppVar14 = local_190;
                if (ppVar15[-1].first !=
                    local_110.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar41].first) break;
                if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [*(long *)(((_Elt_pointer)
                             ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node +
                             -0x10))->second + 0x1f8) - uVar9] =
                       local_110.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar41].second;
                  operator_delete(local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first);
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first =
                       (_Elt_pointer)
                       ((_Elt_pointer)
                       ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))->
                       second;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last =
                       local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node =
                       (_Map_pointer)
                       &((_Elt_pointer)
                        ((long)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node + -0x10))
                        ->second;
                }
                else {
                  (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - uVar9] =
                       local_110.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar41].second;
                  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
                }
                ppVar14 = local_190;
              } while (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                       local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
            }
          }
        }
      }
    } while ((ppVar13 != ppVar14) && (uVar10 = uVar10 + 1, uVar10 < sVar24));
  }
  if (local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_188 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    ppVar13 = (_Elt_pointer)local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar14 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar15 = local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first;
    do {
      puVar5 = (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      ppVar29 = ppVar13;
      ppVar18 = ppVar14;
      ppVar12 = ppVar15;
      while( true ) {
        lVar40 = (long)ppVar18 - (long)ppVar12 >> 4;
        uVar10 = lVar40 - 1;
        if (uVar10 < 0x20) {
          ppVar26 = ppVar18 + -1;
        }
        else {
          uVar41 = uVar10 >> 5 | 0xf800000000000000;
          if (1 < lVar40) {
            uVar41 = uVar10 >> 5;
          }
          ppVar26 = (_Elt_pointer)((uVar10 + uVar41 * -0x20) * 0x10 + (&ppVar29->first)[uVar41]);
        }
        if (ppVar26 == local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        ppVar26 = ppVar14;
        if (ppVar14 == ppVar15) {
          ppVar26 = (_Elt_pointer)(ppVar13[-1].second + 0x200);
        }
        if (uVar10 < 0x20) {
          ppVar43 = ppVar18 + -1;
          ppVar42 = ppVar12;
          ppVar19 = ppVar29;
        }
        else {
          uVar41 = uVar10 >> 5 | 0xf800000000000000;
          if (1 < lVar40) {
            uVar41 = uVar10 >> 5;
          }
          ppVar19 = (_Elt_pointer)(&ppVar29->first + uVar41);
          ppVar42 = (_Elt_pointer)ppVar19->first;
          ppVar43 = ppVar42 + uVar10 + uVar41 * -0x20;
          right_nsv = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_198;
        }
        if (ppVar43 == ppVar42) {
          ppVar43 = (_Elt_pointer)(ppVar19[-1].second + 0x200);
        }
        if (ppVar26[-1].first != ppVar43[-1].first) break;
        if (ppVar18 == ppVar12) {
          ppVar12 = (_Elt_pointer)ppVar29[-1].second;
          ppVar29 = (_Elt_pointer)&ppVar29[-1].second;
          ppVar18 = ppVar12 + 0x20;
        }
        ppVar26 = ppVar14;
        if (ppVar14 == ppVar15) {
          ppVar26 = (_Elt_pointer)(ppVar13[-1].second + 0x200);
        }
        ppVar18 = ppVar18 + -1;
        ppVar43 = ppVar18;
        if (ppVar18 == ppVar12) {
          ppVar43 = (_Elt_pointer)(ppVar29[-1].second + 0x200);
        }
        puVar5[ppVar43[-1].second - uVar9] = ppVar26[-1].second;
      }
      if (ppVar14 == ppVar15) {
        ppVar14 = (_Elt_pointer)(ppVar13[-1].second + 0x200);
      }
      *(unsigned_long *)((long)local_188 + (ppVar14[-1].second - uVar9) * 8) = local_f8;
      if (ppVar18 == ppVar12) {
        ppVar12 = (_Elt_pointer)ppVar29[-1].second;
        ppVar29 = (_Elt_pointer)&ppVar29[-1].second;
        ppVar18 = ppVar12 + 0x20;
      }
      ppVar14 = ppVar18 + -1;
      ppVar13 = ppVar29;
      ppVar15 = ppVar12;
    } while (ppVar14 != local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_178,&local_110);
  if (local_110.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_110.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Elt_pointer)
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Deque_base(&local_1e8);
  return;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}